

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.h
# Opt level: O0

void __thiscall FlasherInfo::~FlasherInfo(FlasherInfo *this)

{
  FlasherInfo *this_local;
  
  ~FlasherInfo(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

virtual ~FlasherInfo() {}